

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_encode_utils.c
# Opt level: O3

int CompareHuffmanTrees(void *ptr1,void *ptr2)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  
  uVar1 = *ptr2;
  iVar3 = -1;
  uVar2 = *ptr1;
  if ((uVar1 > uVar2 || uVar2 == uVar1) && (iVar3 = 1, uVar1 <= uVar2)) {
    iVar3 = (uint)(*(int *)((long)ptr2 + 4) <= *(int *)((long)ptr1 + 4)) * 2 + -1;
  }
  return iVar3;
}

Assistant:

static int CompareHuffmanTrees(const void* ptr1, const void* ptr2) {
  const HuffmanTree* const t1 = (const HuffmanTree*)ptr1;
  const HuffmanTree* const t2 = (const HuffmanTree*)ptr2;
  if (t1->total_count_ > t2->total_count_) {
    return -1;
  } else if (t1->total_count_ < t2->total_count_) {
    return 1;
  } else {
    assert(t1->value_ != t2->value_);
    return (t1->value_ < t2->value_) ? -1 : 1;
  }
}